

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O0

void __thiscall xmrig::OclBackendPrivate::start(OclBackendPrivate *this,Job *job)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  int __c;
  OclLaunchData **__s;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *in_RDI;
  OclLaunchData *data;
  iterator __end2;
  iterator __begin2;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *__range2;
  size_t i;
  uint32_t in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  OclLaunchStatus *in_stack_fffffffffffffed0;
  Job *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff04;
  OclLaunchStatus *local_e8;
  Workers<xmrig::OclLaunchData> *in_stack_ffffffffffffff60;
  bool local_89;
  string local_88 [24];
  String local_58;
  reference local_48;
  OclLaunchData *local_40;
  __normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
  local_38;
  pointer *local_30;
  long local_28;
  
  Log::print("\x1b[1;37m|  # | GPU |  BUS ID |    I |  W | SI | MC |  U |  MEM | NAME\x1b[0m");
  local_28 = 0;
  local_30 = &in_RDI[3].
              super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38._M_current =
       (OclLaunchData *)
       std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::begin
                 ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
                  CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_40 = (OclLaunchData *)
             std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::end
                       ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  while( true ) {
    __s = &local_40;
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
                        *)in_stack_fffffffffffffed0,
                       (__normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
                        *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    if (!bVar2) break;
    local_48 = __gnu_cxx::
               __normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
               ::operator*(&local_38);
    lVar1 = local_28;
    pcVar7 = OclThread::index(&local_48->thread,(char *)__s,__c);
    OclDevice::topology(&local_48->device);
    PciTopology::toString((PciTopology *)in_stack_fffffffffffffef8);
    pcVar8 = String::data(&local_58);
    uVar3 = OclThread::intensity(&local_48->thread);
    uVar4 = OclThread::worksize(&local_48->thread);
    in_stack_fffffffffffffec8 = OclThread::stridedIndex(&local_48->thread);
    uVar5 = OclThread::stridedIndex(&local_48->thread);
    if (uVar5 != 2) {
      local_e8 = (OclLaunchStatus *)0x27efee;
    }
    else {
      OclThread::memChunk(&local_48->thread);
      std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      local_e8 = (OclLaunchStatus *)std::__cxx11::string::c_str();
    }
    local_89 = uVar5 == 2;
    uVar5 = OclThread::unrollFactor(&local_48->thread);
    uVar6 = OclThread::intensity(&local_48->thread);
    OclDevice::printableName((OclDevice *)CONCAT44(uVar4,in_stack_fffffffffffffec8));
    in_stack_ffffffffffffff04 = uVar6;
    pcVar9 = String::data((String *)&stack0xffffffffffffff60);
    Log::print("|\x1b[1;36m%3zu\x1b[0m |\x1b[1;36m%4u\x1b[0m |\x1b[0;33m %7s\x1b[0m |\x1b[1;36m%5u\x1b[0m |\x1b[1;36m%3u\x1b[0m |\x1b[1;36m%3u\x1b[0m |\x1b[1;36m%3s\x1b[0m |\x1b[1;36m%3u\x1b[0m |\x1b[0;36m%5zu\x1b[0m | %s"
               ,lVar1,(ulong)pcVar7 & 0xffffffff,pcVar8,(ulong)uVar3,(ulong)uVar4,
               in_stack_fffffffffffffec8,local_e8,uVar5,uVar6,pcVar9);
    String::~String((String *)local_e8);
    in_stack_fffffffffffffed0 = local_e8;
    if (local_89) {
      std::__cxx11::string::~string(local_88);
      in_stack_fffffffffffffed0 = local_e8;
    }
    String::~String((String *)in_stack_fffffffffffffed0);
    local_28 = local_28 + 1;
    __gnu_cxx::
    __normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
    ::operator++(&local_38);
  }
  OclSharedState::start
            ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
            );
  std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::size
            ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
             &in_RDI[3].
              super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  OclLaunchStatus::start
            (in_stack_fffffffffffffed0,CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
            );
  Workers<xmrig::OclLaunchData>::start(in_stack_ffffffffffffff60,in_RDI);
  return;
}

Assistant:

inline void start(const Job &job)
    {
        Log::print(WHITE_BOLD("|  # | GPU |  BUS ID |    I |  W | SI | MC |  U |  MEM | NAME"));

        size_t i = 0;
        for (const auto &data : threads) {
            Log::print("|" CYAN_BOLD("%3zu") " |" CYAN_BOLD("%4u") " |" YELLOW(" %7s") " |" CYAN_BOLD("%5u") " |" CYAN_BOLD("%3u") " |"
                       CYAN_BOLD("%3u") " |" CYAN_BOLD("%3s") " |" CYAN_BOLD("%3u") " |" CYAN("%5zu") " | %s",
                       i,
                       data.thread.index(),
                       data.device.topology().toString().data(),
                       data.thread.intensity(),
                       data.thread.worksize(),
                       data.thread.stridedIndex(),
                       data.thread.stridedIndex() == 2 ? std::to_string(data.thread.memChunk()).c_str() : "-",
                       data.thread.unrollFactor(),
                       data.thread.intensity(),
                       data.device.printableName().data()
                       );

                    i++;
        }

        OclSharedState::start(threads, job);

        status.start(threads.size());
        workers.start(threads);
    }